

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

int Centaurus::LookaheadDFA<wchar_t>::get_closure_color(CATNClosure *closure)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_color _Var4;
  
  p_Var3 = (closure->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  _Var4 = _S_red;
  while( true ) {
    if ((_Rb_tree_header *)p_Var3 == &(closure->_M_t)._M_impl.super__Rb_tree_header) {
      return _Var4;
    }
    _Var1 = p_Var3[2]._M_color;
    _Var2 = _Var1;
    if ((_Var4 != _S_red) && (_Var2 = _Var4, _Var4 != _Var1 && _Var1 != _S_red)) break;
    _Var4 = _Var2;
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  return -1;
}

Assistant:

static int get_closure_color(const CATNClosure& closure)
	{
		int color = 0;
		for (const auto& p : closure)
		{
			if (color == 0)
			{
				color = p.color();
			}
			else
			{
				if (color != p.color() && p.color() != 0)
					return -1;
			}
		}
		return color;
	}